

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall
Clara::CommandLine<Catch::ConfigData>::bindProcessName<std::__cxx11::string_Catch::ConfigData::*>
          (CommandLine<Catch::ConfigData> *this,
          offset_in_ConfigData_to_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
          f)

{
  IArgFunction<Catch::ConfigData> *pIVar1;
  undefined8 *puVar2;
  undefined **ppuVar3;
  IArgFunction<Catch::ConfigData> *pIVar4;
  
  puVar2 = (undefined8 *)operator_new(0x10);
  ppuVar3 = &PTR__IArgFunction_001626a8;
  *puVar2 = &PTR__IArgFunction_001626a8;
  puVar2[1] = f;
  pIVar4 = (IArgFunction<Catch::ConfigData> *)operator_new(0x10);
  pIVar4->_vptr_IArgFunction = (_func_int **)&PTR__IArgFunction_001626a8;
  pIVar4[1]._vptr_IArgFunction = (_func_int **)f;
  pIVar1 = (this->m_boundProcessName).functionObj;
  if (pIVar1 != (IArgFunction<Catch::ConfigData> *)0x0) {
    (*pIVar1->_vptr_IArgFunction[1])();
    ppuVar3 = (undefined **)*puVar2;
  }
  (this->m_boundProcessName).functionObj = pIVar4;
  (*(code *)ppuVar3[1])(puVar2);
  return;
}

Assistant:

void bindProcessName( F f ) {
            m_boundProcessName = Detail::makeBoundField( f );
        }